

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::callExport
          (Literals *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Name name,
          Literals *arguments)

{
  IString name_00;
  long lVar1;
  IString *pIVar2;
  Name NVar3;
  SmallVector<wasm::Literal,_1UL> local_70;
  SmallVector<wasm::Literal,_1UL> *local_38;
  
  NVar3.super_IString.str._M_str = name.super_IString.str._M_len;
  NVar3.super_IString.str._M_len = (size_t)this->wasm;
  local_38 = &arguments->super_SmallVector<wasm::Literal,_1UL>;
  lVar1 = wasm::Module::getExportOrNull(NVar3);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 0x10) != 0)) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"callExport not found");
  }
  pIVar2 = (IString *)0x0;
  if (*(char *)(lVar1 + 0x28) == '\0') {
    pIVar2 = (IString *)(lVar1 + 0x18);
  }
  name_00.str = pIVar2->str;
  SmallVector<wasm::Literal,_1UL>::SmallVector(&local_70,local_38);
  callFunction(__return_storage_ptr__,this,(Name)name_00.str,(Literals *)&local_70);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_70.flexible);
  wasm::Literal::~Literal(local_70.fixed._M_elems);
  return __return_storage_ptr__;
}

Assistant:

Literals callExport(Name name, const Literals& arguments) {
    Export* export_ = wasm.getExportOrNull(name);
    if (!export_ || export_->kind != ExternalKind::Function) {
      externalInterface->trap("callExport not found");
    }
    return callFunction(*export_->getInternalName(), arguments);
  }